

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O3

int secp256k1_ellswift_encode
              (secp256k1_context *ctx,uchar *ell64,secp256k1_pubkey *pubkey,uchar *rnd32)

{
  int iVar1;
  size_t ser_size;
  secp256k1_fe t;
  secp256k1_ge p;
  uchar p64 [64];
  size_t local_160;
  secp256k1_fe local_158;
  secp256k1_ge local_130;
  uchar local_d8 [64];
  secp256k1_sha256 local_98;
  
  if (ell64 == (uchar *)0x0) {
    secp256k1_ellswift_encode_cold_3();
  }
  else if (pubkey == (secp256k1_pubkey *)0x0) {
    secp256k1_ellswift_encode_cold_2();
  }
  else if (rnd32 == (uchar *)0x0) {
    secp256k1_ellswift_encode_cold_1();
  }
  else {
    iVar1 = secp256k1_pubkey_load(ctx,&local_130,pubkey);
    if (iVar1 != 0) {
      local_d8[0x30] = '\0';
      local_d8[0x31] = '\0';
      local_d8[0x32] = '\0';
      local_d8[0x33] = '\0';
      local_d8[0x34] = '\0';
      local_d8[0x35] = '\0';
      local_d8[0x36] = '\0';
      local_d8[0x37] = '\0';
      local_d8[0x38] = '\0';
      local_d8[0x39] = '\0';
      local_d8[0x3a] = '\0';
      local_d8[0x3b] = '\0';
      local_d8[0x3c] = '\0';
      local_d8[0x3d] = '\0';
      local_d8[0x3e] = '\0';
      local_d8[0x3f] = '\0';
      local_d8[0x20] = '\0';
      local_d8[0x21] = '\0';
      local_d8[0x22] = '\0';
      local_d8[0x23] = '\0';
      local_d8[0x24] = '\0';
      local_d8[0x25] = '\0';
      local_d8[0x26] = '\0';
      local_d8[0x27] = '\0';
      local_d8[0x28] = '\0';
      local_d8[0x29] = '\0';
      local_d8[0x2a] = '\0';
      local_d8[0x2b] = '\0';
      local_d8[0x2c] = '\0';
      local_d8[0x2d] = '\0';
      local_d8[0x2e] = '\0';
      local_d8[0x2f] = '\0';
      local_d8[0x10] = '\0';
      local_d8[0x11] = '\0';
      local_d8[0x12] = '\0';
      local_d8[0x13] = '\0';
      local_d8[0x14] = '\0';
      local_d8[0x15] = '\0';
      local_d8[0x16] = '\0';
      local_d8[0x17] = '\0';
      local_d8[0x18] = '\0';
      local_d8[0x19] = '\0';
      local_d8[0x1a] = '\0';
      local_d8[0x1b] = '\0';
      local_d8[0x1c] = '\0';
      local_d8[0x1d] = '\0';
      local_d8[0x1e] = '\0';
      local_d8[0x1f] = '\0';
      local_d8[0] = '\0';
      local_d8[1] = '\0';
      local_d8[2] = '\0';
      local_d8[3] = '\0';
      local_d8[4] = '\0';
      local_d8[5] = '\0';
      local_d8[6] = '\0';
      local_d8[7] = '\0';
      local_d8[8] = '\0';
      local_d8[9] = '\0';
      local_d8[10] = '\0';
      local_d8[0xb] = '\0';
      local_d8[0xc] = '\0';
      local_d8[0xd] = '\0';
      local_d8[0xe] = '\0';
      local_d8[0xf] = '\0';
      local_98.s[0] = 0xd1a6524b;
      local_98.s[1] = 0x28594b3;
      local_98.s[2] = 0x96e42f4e;
      local_98.s[3] = 0x1037a177;
      local_98.s[4] = 0x1b8fcb8b;
      local_98.s[5] = 0x56023885;
      local_98.s[6] = 0x2560ede1;
      local_98.s[7] = 0xd626b715;
      local_98.bytes = 0x40;
      secp256k1_eckey_pubkey_serialize(&local_130,local_d8,&local_160,1);
      secp256k1_sha256_write(&local_98,local_d8,0x40);
      secp256k1_sha256_write(&local_98,rnd32,0x20);
      secp256k1_ellswift_elligatorswift_var(ell64,&local_158,&local_130,&local_98);
      secp256k1_fe_impl_get_b32(ell64 + 0x20,&local_158);
      return 1;
    }
    ell64[0x30] = '\0';
    ell64[0x31] = '\0';
    ell64[0x32] = '\0';
    ell64[0x33] = '\0';
    ell64[0x34] = '\0';
    ell64[0x35] = '\0';
    ell64[0x36] = '\0';
    ell64[0x37] = '\0';
    ell64[0x38] = '\0';
    ell64[0x39] = '\0';
    ell64[0x3a] = '\0';
    ell64[0x3b] = '\0';
    ell64[0x3c] = '\0';
    ell64[0x3d] = '\0';
    ell64[0x3e] = '\0';
    ell64[0x3f] = '\0';
    ell64[0x20] = '\0';
    ell64[0x21] = '\0';
    ell64[0x22] = '\0';
    ell64[0x23] = '\0';
    ell64[0x24] = '\0';
    ell64[0x25] = '\0';
    ell64[0x26] = '\0';
    ell64[0x27] = '\0';
    ell64[0x28] = '\0';
    ell64[0x29] = '\0';
    ell64[0x2a] = '\0';
    ell64[0x2b] = '\0';
    ell64[0x2c] = '\0';
    ell64[0x2d] = '\0';
    ell64[0x2e] = '\0';
    ell64[0x2f] = '\0';
    ell64[0x10] = '\0';
    ell64[0x11] = '\0';
    ell64[0x12] = '\0';
    ell64[0x13] = '\0';
    ell64[0x14] = '\0';
    ell64[0x15] = '\0';
    ell64[0x16] = '\0';
    ell64[0x17] = '\0';
    ell64[0x18] = '\0';
    ell64[0x19] = '\0';
    ell64[0x1a] = '\0';
    ell64[0x1b] = '\0';
    ell64[0x1c] = '\0';
    ell64[0x1d] = '\0';
    ell64[0x1e] = '\0';
    ell64[0x1f] = '\0';
    ell64[0] = '\0';
    ell64[1] = '\0';
    ell64[2] = '\0';
    ell64[3] = '\0';
    ell64[4] = '\0';
    ell64[5] = '\0';
    ell64[6] = '\0';
    ell64[7] = '\0';
    ell64[8] = '\0';
    ell64[9] = '\0';
    ell64[10] = '\0';
    ell64[0xb] = '\0';
    ell64[0xc] = '\0';
    ell64[0xd] = '\0';
    ell64[0xe] = '\0';
    ell64[0xf] = '\0';
  }
  return 0;
}

Assistant:

int secp256k1_ellswift_encode(const secp256k1_context *ctx, unsigned char *ell64, const secp256k1_pubkey *pubkey, const unsigned char *rnd32) {
    secp256k1_ge p;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(ell64 != NULL);
    ARG_CHECK(pubkey != NULL);
    ARG_CHECK(rnd32 != NULL);

    if (secp256k1_pubkey_load(ctx, &p, pubkey)) {
        secp256k1_fe t;
        unsigned char p64[64] = {0};
        size_t ser_size;
        int ser_ret;
        secp256k1_sha256 hash;

        /* Set up hasher state; the used RNG is H(pubkey || "\x00"*31 || rnd32 || cnt++), using
         * BIP340 tagged hash with tag "secp256k1_ellswift_encode". */
        secp256k1_ellswift_sha256_init_encode(&hash);
        ser_ret = secp256k1_eckey_pubkey_serialize(&p, p64, &ser_size, 1);
#ifdef VERIFY
        VERIFY_CHECK(ser_ret && ser_size == 33);
#else
        (void)ser_ret;
#endif
        secp256k1_sha256_write(&hash, p64, sizeof(p64));
        secp256k1_sha256_write(&hash, rnd32, 32);

        /* Compute ElligatorSwift encoding and construct output. */
        secp256k1_ellswift_elligatorswift_var(ell64, &t, &p, &hash); /* puts u in ell64[0..32] */
        secp256k1_fe_get_b32(ell64 + 32, &t); /* puts t in ell64[32..64] */
        return 1;
    }
    /* Only reached in case the provided pubkey is invalid. */
    memset(ell64, 0, 64);
    return 0;
}